

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall nnad::Matrix<double>::operator=(Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  Matrix<double> *in_RSI;
  int *in_RDI;
  Matrix<double> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  iVar1 = GetLines(in_RSI);
  *in_RDI = iVar1;
  iVar1 = GetColumns(in_RSI);
  in_RDI[1] = iVar1;
  GetVector(in_stack_ffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void operator = (Matrix<T> const& term)
    {
      _Lines   = term.GetLines();
      _Columns = term.GetColumns();
      _Matrix  = term.GetVector();
    }